

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v7::print<char[10],double&,double&,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,char (*format_str) [10],
               double *args,double *args_1)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  double local_38 [2];
  double local_28;
  
  format_str_00 = to_string_view<char,_0>(*format_str);
  local_38[0] = *args;
  local_28 = *args_1;
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_38;
  args_00.desc_ = 0xaa;
  vprint<char>(os,format_str_00,args_00);
  return;
}

Assistant:

void print(std::basic_ostream<Char>& os, const S& format_str, Args&&... args) {
  vprint(os, to_string_view(format_str),
         fmt::make_args_checked<Args...>(format_str, args...));
}